

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void VW::cmd_string_replace_value(stringstream **ss,string *flag_to_replace,string *new_value)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  string cmd;
  string local_40 [8];
  long local_38;
  
  std::__cxx11::string::append((char *)flag_to_replace);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find(local_40,(ulong)flag_to_replace);
  if (lVar1 == -1) {
    poVar2 = std::operator<<((ostream *)(*ss + 0x10)," ");
    poVar2 = std::operator<<(poVar2,(string *)flag_to_replace);
    std::operator<<(poVar2,(string *)new_value);
  }
  else {
    uVar3 = lVar1 + flag_to_replace->_M_string_length;
    lVar1 = std::__cxx11::string::find((char *)local_40,0x23de7c);
    if (lVar1 == -1) {
      lVar1 = local_38;
    }
    std::__cxx11::string::replace((ulong)local_40,uVar3,(string *)(lVar1 - uVar3));
    std::__cxx11::stringbuf::str((string *)(*ss + 0x18));
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmd_string_replace_value(std::stringstream*& ss, string flag_to_replace, string new_value)
{
  flag_to_replace.append(
      " ");  // add a space to make sure we obtain the right flag in case 2 flags start with the same set of characters
  string cmd = ss->str();
  size_t pos = cmd.find(flag_to_replace);
  if (pos == string::npos)
    // flag currently not present in command string, so just append it to command string
    *ss << " " << flag_to_replace << new_value;
  else
  {
    // flag is present, need to replace old value with new value

    // compute position after flag_to_replace
    pos += flag_to_replace.size();

    // now pos is position where value starts
    // find position of next space
    size_t pos_after_value = cmd.find(" ", pos);
    if (pos_after_value == string::npos)
    {
      // we reach the end of the string, so replace the all characters after pos by new_value
      cmd.replace(pos, cmd.size() - pos, new_value);
    }
    else
    {
      // replace characters between pos and pos_after_value by new_value
      cmd.replace(pos, pos_after_value - pos, new_value);
    }

    ss->str(cmd);
  }
}